

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::SwapFieldHelper::SwapArenaStringPtr
               (ArenaStringPtr *lhs,Arena *lhs_arena,ArenaStringPtr *rhs,Arena *rhs_arena)

{
  bool bVar1;
  string *psVar2;
  undefined1 local_48 [8];
  string temp;
  Arena *rhs_arena_local;
  ArenaStringPtr *rhs_local;
  Arena *lhs_arena_local;
  ArenaStringPtr *lhs_local;
  
  temp.field_2._8_8_ = rhs_arena;
  if (lhs_arena == rhs_arena) {
    ArenaStringPtr::InternalSwap(lhs,rhs,lhs_arena);
  }
  else {
    bVar1 = ArenaStringPtr::IsDefault(lhs);
    if ((!bVar1) || (bVar1 = ArenaStringPtr::IsDefault(rhs), !bVar1)) {
      bVar1 = ArenaStringPtr::IsDefault(lhs);
      if (bVar1) {
        psVar2 = ArenaStringPtr::Get_abi_cxx11_(rhs);
        ArenaStringPtr::Set<>(lhs,psVar2,lhs_arena);
        ArenaStringPtr::Destroy(rhs);
        ArenaStringPtr::InitDefault(rhs);
      }
      else {
        bVar1 = ArenaStringPtr::IsDefault(rhs);
        if (bVar1) {
          psVar2 = ArenaStringPtr::Get_abi_cxx11_(lhs);
          ArenaStringPtr::Set<>(rhs,psVar2,(Arena *)temp.field_2._8_8_);
          ArenaStringPtr::Destroy(lhs);
          ArenaStringPtr::InitDefault(lhs);
        }
        else {
          psVar2 = ArenaStringPtr::Get_abi_cxx11_(lhs);
          std::__cxx11::string::string((string *)local_48,(string *)psVar2);
          psVar2 = ArenaStringPtr::Get_abi_cxx11_(rhs);
          ArenaStringPtr::Set<>(lhs,psVar2,lhs_arena);
          ArenaStringPtr::Set(rhs,(string *)local_48,(Arena *)temp.field_2._8_8_);
          std::__cxx11::string::~string((string *)local_48);
        }
      }
    }
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapArenaStringPtr(ArenaStringPtr* lhs, Arena* lhs_arena,
                                         ArenaStringPtr* rhs,
                                         Arena* rhs_arena) {
  if (lhs_arena == rhs_arena) {
    ArenaStringPtr::InternalSwap(lhs, rhs, lhs_arena);
  } else if (lhs->IsDefault() && rhs->IsDefault()) {
    // Nothing to do.
  } else if (lhs->IsDefault()) {
    lhs->Set(rhs->Get(), lhs_arena);
    // rhs needs to be destroyed before overwritten.
    rhs->Destroy();
    rhs->InitDefault();
  } else if (rhs->IsDefault()) {
    rhs->Set(lhs->Get(), rhs_arena);
    // lhs needs to be destroyed before overwritten.
    lhs->Destroy();
    lhs->InitDefault();
  } else {
    std::string temp = lhs->Get();
    lhs->Set(rhs->Get(), lhs_arena);
    rhs->Set(std::move(temp), rhs_arena);
  }
}